

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.h
# Opt level: O3

void __thiscall SQVM::GrowCallStack(SQVM *this)

{
  SQUnsignedInteger newsize;
  CallInfo local_68;
  
  newsize = this->_alloccallsstacksize * 2;
  local_68._closure.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_68._prevtop = 0;
  local_68._target = 0;
  local_68._ncalls = 0;
  local_68._60_4_ = 0;
  local_68._generator = (SQGenerator *)0x0;
  local_68._etraps = 0;
  local_68._prevstkbase = 0;
  local_68._ip = (SQInstruction *)0x0;
  local_68._literals = (SQObjectPtr *)0x0;
  local_68._root = 0;
  local_68._closure.super_SQObject._type = OT_NULL;
  local_68._closure.super_SQObject._4_4_ = 0;
  sqvector<SQVM::CallInfo>::resize(&this->_callstackdata,newsize,&local_68);
  SQObjectPtr::~SQObjectPtr(&local_68._closure);
  this->_callsstack = (this->_callstackdata)._vals;
  this->_alloccallsstacksize = newsize;
  return;
}

Assistant:

void GrowCallStack() {
        SQInteger newsize = _alloccallsstacksize*2;
        _callstackdata.resize(newsize);
        _callsstack = &_callstackdata[0];
        _alloccallsstacksize = newsize;
    }